

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::FullUncertainty
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  pointer pmVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  code *pcVar5;
  _Rb_tree_node_base *p_Var6;
  undefined4 in_register_0000000c;
  long lVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  pair<const_outkey2,_OutLosses> x_1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  float local_bc;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_b8;
  vector<int,_std::allocator<int>_> *local_90;
  undefined8 local_88;
  undefined1 auStack_80 [8];
  undefined4 local_78;
  _Rb_tree_node_base *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar1 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  plVar8 = (long *)((long)&local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start +
                   CONCAT44(in_register_0000000c,epcalc) + 4);
  local_90 = fileIDs;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = *(_Base_ptr *)((long)&pmVar1[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var4 != &pmVar1[1]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = *(undefined4 *)&p_Var4[1]._M_left;
    local_b8.first = p_Var4[1]._M_color;
    local_b8._4_4_ = *(undefined4 *)&p_Var4[1].field_0x4;
    local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)p_Var4[1]._M_parent;
    pmVar3 = std::
             map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                           *)&local_60,&local_b8.first);
    pcVar5 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      pcVar5 = *(code **)(*plVar8 + -1 + GetOutLoss);
    }
    uVar10 = (*pcVar5)(plVar8);
    local_88 = CONCAT44(local_88._4_4_,uVar10);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(pmVar3,(float *)&local_88);
  }
  WriteExceedanceProbabilityTable
            (this,local_90,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&local_60,(double)((long)this->samplesize_ * (long)this->totalperiods_),eptype,
             eptype_tvar,in_stack_00000008,1);
  if ((this->ordFlag_ == false) &&
     ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_68 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var6 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var6 != local_68; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                (&local_b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var6 + 1))
      ;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::clear(&local_60);
      pmVar1 = (this->out_loss_->
               super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (p_Var4 = *(_Base_ptr *)((long)&pmVar1[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var4 != &pmVar1[1]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        local_78 = *(undefined4 *)&p_Var4[1]._M_left;
        local_88 = *(undefined8 *)(p_Var4 + 1);
        auStack_80 = (undefined1  [8])p_Var4[1]._M_parent;
        p_Var2 = (_Base_ptr)
                 CONCAT44(local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish._4_4_,
                          local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_4_);
        for (p_Var9 = (_Base_ptr)
                      local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; p_Var9 != p_Var2;
            p_Var9 = (_Base_ptr)&p_Var9->field_0x4) {
          if (auStack_80._0_4_ == p_Var9->_M_color) {
            pmVar3 = std::
                     map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                   *)&local_60,(key_type *)&local_88);
            pcVar5 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar5 = *(code **)(*(long *)(auStack_80 + CONCAT44(in_register_0000000c,epcalc) + 4)
                                  + -1 + GetOutLoss);
            }
            local_bc = (float)(*pcVar5)(auStack_80 + CONCAT44(in_register_0000000c,epcalc) + 4);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>(pmVar3,&local_bc);
          }
        }
      }
      lVar7 = (CONCAT44(local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_,
                        local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_4_) -
               (long)local_b8.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * (long)this->totalperiods_;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      WriteExceedanceProbabilityTable
                (this,local_90,
                 (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)&local_60,
                 (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0),eptype,
                 local_b8.first,in_stack_00000008,1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_b8.second.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void aggreports::FullUncertainty(const std::vector<int> &fileIDs,
				 OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				 const int epcalc, const int eptype,
				 const int eptype_tvar) {

  std::map<int, lossvec> items;

  for (auto x : (*out_loss_)[SAMPLES]) {
    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
  }

  WriteExceedanceProbabilityTable(fileIDs, items,
				  (long)totalperiods_ * samplesize_, epcalc,
				  eptype, eptype_tvar);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
	  }
	}
      }
      WriteExceedanceProbabilityTable(fileIDs, items,
	(long)totalperiods_ * ensemble.second.size(), epcalc, ensemble.first,
	eptype_tvar, 1);
    }
  }

}